

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

string * __thiscall
vkt::sparse::getShaderImageDataType_abi_cxx11_
          (string *__return_storage_ptr__,sparse *this,TextureFormat *format)

{
  TextureChannelClass TVar1;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  sparse *local_18;
  TextureFormat *format_local;
  
  local_18 = this;
  format_local = (TextureFormat *)__return_storage_ptr__;
  TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ivec4",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uvec4",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else if (TVar1 == TEXTURECHANNELCLASS_FLOATING_POINT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"vec4",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderImageDataType(const tcu::TextureFormat& format)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return "uvec4";
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return "ivec4";
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			return "vec4";
		default:
			DE_ASSERT(false);
			return "";
	}
}